

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O2

void __thiscall PeleLM::setTimeLevel(PeleLM *this,Real time,Real dt_old,Real dt_new)

{
  NavierStokesBase::setTimeLevel(&this->super_NavierStokesBase,time,dt_old,dt_new);
  amrex::StateData::setTimeLevel
            ((this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start + RhoYdot_Type,time,dt_old,dt_new);
  amrex::StateData::setTimeLevel
            ((this->super_NavierStokesBase).super_AmrLevel.state.
             super_vector<amrex::StateData,_std::allocator<amrex::StateData>_>.
             super__Vector_base<amrex::StateData,_std::allocator<amrex::StateData>_>._M_impl.
             super__Vector_impl_data._M_start + FuncCount_Type,time,dt_old,dt_new);
  return;
}

Assistant:

void
PeleLM::setTimeLevel (Real time,
                      Real dt_old,
                      Real dt_new)
{
   NavierStokesBase::setTimeLevel(time, dt_old, dt_new);

   state[RhoYdot_Type].setTimeLevel(time,dt_old,dt_new);

   state[FuncCount_Type].setTimeLevel(time,dt_old,dt_new);
}